

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coverage.cpp
# Opt level: O0

void __thiscall
CoverageValidator_invalidXmlIds_Test::~CoverageValidator_invalidXmlIds_Test
          (CoverageValidator_invalidXmlIds_Test *this)

{
  CoverageValidator_invalidXmlIds_Test *this_local;
  
  ~CoverageValidator_invalidXmlIds_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CoverageValidator, invalidXmlIds)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("coverage/invalidxmlids.cellml"));

    auto validator = libcellml::Validator::create();

    validator->validateModel(model);
    EXPECT_EQ(size_t(1), validator->errorCount());
    EXPECT_EQ("Units 'bob8' does not have a valid 'id' attribute, '\xF3\xBF\xBF\xBFid'.", validator->error(0)->description());
}